

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::CollectMemOpInfo
          (GlobOpt *this,Instr *instrBegin,Instr *instr,Value *src1Val,Value *src2Val)

{
  Instr **ppIVar1;
  OpCode OVar2;
  Type pSVar3;
  Opnd *this_00;
  BasicBlock *pBVar4;
  Instr *pIVar5;
  SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  long lVar6;
  InductionVariableChangeInfoMap *this_03;
  code *pcVar7;
  uint uVar8;
  bool bVar9;
  OpndKind OVar10;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  JITTimeFunctionBody *pJVar14;
  FunctionJITTimeInfo *pFVar15;
  char16 *pcVar16;
  char16 *pcVar17;
  GlobOpt *this_04;
  GlobOpt *pGVar18;
  InductionVariable *pIVar19;
  RegOpnd *pRVar20;
  Value *pVVar21;
  Type *ppMVar22;
  MemCopyCandidate *pMVar23;
  StackSym *pSVar24;
  StackSym *pSVar25;
  IntConstOpnd *pIVar26;
  InductionVariableChangeInfo *pIVar27;
  byte bVar28;
  Loop *loop;
  GlobOpt *this_05;
  SymID SVar29;
  Instr *pIVar30;
  Instr *instr_00;
  SymID local_b8 [2];
  char16 debugStringBuffer [42];
  uint local_34 [2];
  int constValue;
  
  loop = this->currentBlock->loop;
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x86d,"(this->currentBlock->loop)","this->currentBlock->loop");
    if (!bVar9) goto LAB_00447387;
    *puVar13 = 0;
    loop = this->currentBlock->loop;
  }
  pSVar3 = (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  if ((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar3 == &loop->blockList) {
    return false;
  }
  if ((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar3->next->next !=
      &loop->blockList) {
    return false;
  }
  if ((((byte)loop->loopFlags >> 1 | ~(byte)loop->loopFlags) & 1) == 0) {
    if (DAT_015bc46a == '\x01') {
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
      pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
      bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar11,uVar12);
      if (!bVar9) {
        pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
        pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
        bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemSetPhase,uVar11,uVar12);
        if (!bVar9) {
          pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
          pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
          uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
          bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar11,uVar12);
          if (!bVar9) goto LAB_00447039;
        }
      }
      Output::Print(L"TRACE MemOp:");
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar14);
      pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar15,(wchar (*) [42])local_b8);
      uVar11 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar16,pcVar17,(ulong)uVar11);
      Output::Print(L"minimum loop count not reached");
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
        pcVar16 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
        Output::Print(L" (%s)",pcVar16);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
    goto LAB_00447039;
  }
  unique0x10000fb1 = src2Val;
  if ((loop->field_0x179 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x87d,"(loop->doMemOp)","loop->doMemOp");
    if (!bVar9) goto LAB_00447387;
    *puVar13 = 0;
  }
  OVar2 = instr->m_opcode;
  if (OVar2 < StElemI_A_Strict) {
    if (OVar2 == LdElemI_A) {
      bVar9 = CollectMemOpLdElementI(this,instr,loop);
    }
    else {
      if (OVar2 != StElemI_A) goto LAB_00446dc5;
LAB_00446bbe:
      bVar9 = CollectMemOpStElementI(this,instr,loop);
    }
    if (bVar9 != false) {
      return true;
    }
LAB_00447039:
    loop->field_0x179 = loop->field_0x179 & 0xfb;
    return false;
  }
  if (OVar2 == Sub_I4) {
    bVar28 = 0;
  }
  else {
    bVar28 = 0x80;
    if (OVar2 != Add_I4) {
      if (OVar2 != StElemI_A_Strict) goto LAB_00446dc5;
      goto LAB_00446bbe;
    }
  }
  pIVar5 = instr->m_next;
  pSVar24 = IR::Opnd::GetStackSym(instr->m_dst);
  if ((pSVar24 == (StackSym *)0x0) ||
     (OVar10 = IR::Opnd::GetKind(instr->m_dst), OVar10 != OpndKindReg)) {
LAB_00446ce4:
    bVar9 = false;
  }
  else {
    pSVar24 = IR::Opnd::GetStackSym(instr->m_dst);
    pSVar25 = IR::Opnd::GetStackSym(instr->m_src1);
    if (pSVar24 != pSVar25) {
      if ((((pIVar5 != (Instr *)0x0) && (pIVar5->m_opcode == Ld_A)) &&
          (OVar10 = IR::Opnd::GetKind(pIVar5->m_src1), OVar10 == OpndKindReg)) &&
         (OVar10 = IR::Opnd::GetKind(pIVar5->m_dst), OVar10 == OpndKindReg)) {
        pSVar24 = IR::Opnd::GetStackSym(instr->m_dst);
        SVar29 = 0xffffffff;
        if ((pSVar24 != (StackSym *)0x0) &&
           ((pSVar24->m_type == TyVar ||
            (pSVar24 = StackSym::GetVarEquivSym(pSVar24,(Func *)0x0), pSVar24 != (StackSym *)0x0))))
        {
          SVar29 = (pSVar24->super_Sym).m_id;
        }
        pSVar24 = IR::Opnd::GetStackSym(pIVar5->m_src1);
        if (SVar29 == (pSVar24->super_Sym).m_id) {
          pSVar24 = IR::Opnd::GetStackSym(instr->m_src1);
          SVar29 = 0xffffffff;
          if ((pSVar24 != (StackSym *)0x0) &&
             ((pSVar24->m_type == TyVar ||
              (pSVar24 = StackSym::GetVarEquivSym(pSVar24,(Func *)0x0), pSVar24 != (StackSym *)0x0))
             )) {
            SVar29 = (pSVar24->super_Sym).m_id;
          }
          pSVar24 = IR::Opnd::GetStackSym(pIVar5->m_dst);
          if (SVar29 == (pSVar24->super_Sym).m_id) goto LAB_00446cdd;
        }
      }
      goto LAB_00446ce4;
    }
LAB_00446cdd:
    bVar9 = true;
  }
  this_05 = (GlobOpt *)instr->m_src1;
  this_04 = (GlobOpt *)IR::Opnd::GetStackSym((Opnd *)this_05);
  local_b8[0] = 0xffffffff;
  if ((this_04 != (GlobOpt *)0x0) &&
     ((pGVar18 = this_04, *(IRType *)((long)&this_04->intConstantToValueMap + 4) == TyVar ||
      (this_05 = this_04,
      pGVar18 = (GlobOpt *)StackSym::GetVarEquivSym((StackSym *)this_04,(Func *)0x0),
      pGVar18 != (GlobOpt *)0x0)))) {
    local_b8[0] = *(SymID *)&pGVar18->intConstantToStackSymMap;
  }
  if ((!bVar9) ||
     (pIVar19 = GetInductionVariable(this_05,local_b8[0],this->currentBlock->loop),
     pIVar19 == (InductionVariable *)0x0)) {
LAB_00446dc5:
    pIVar5 = instr->m_next;
    instr_00 = instrBegin->m_next;
    if (instr_00 != pIVar5) {
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      pIVar30 = (Instr *)0x0;
      do {
        if ((pIVar30 != (Instr *)0x0) && (pIVar30->m_next != instr_00)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x917,
                             "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == chkInstr)"
                             ,"Modifying instr list but not using EDITING iterator!");
          if (!bVar9) goto LAB_00447387;
          *puVar13 = 0;
        }
        bVar9 = IsInstrInvalidForMemOp(this,instr_00,loop,src1Val,stack0xffffffffffffffa0);
        if (bVar9) goto LAB_00447039;
        if ((loop->memOpInfo != (MemOpInfo *)0x0) &&
           (this_01 = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                      loop->memOpInfo->candidates,
           (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
           (this_01->super_SListNodeBase<Memory::ArenaAllocator>).next != this_01)) {
          ppMVar22 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (this_01);
          if (((*ppMVar22)->type == MEMCOPY) &&
             ((pMVar23 = Loop::MemOpCandidate::AsMemCopy(*ppMVar22),
              (pMVar23->super_MemOpCandidate).base == 0xffffffff &&
              (bVar9 = IR::Instr::HasSymUse(instr_00,pMVar23->transferSym), bVar9)))) {
            loop->field_0x179 = loop->field_0x179 & 0xfb;
            if (DAT_015bc46a != '\x01') {
              return false;
            }
            pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
            pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
            bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar11,uVar12);
            if (!bVar9) {
              pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
              pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
              bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar11,uVar12);
              if (!bVar9) {
                return false;
              }
            }
            Output::Print(L"TRACE MemCopy:");
            pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar14);
            pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar15,(wchar (*) [42])local_b8);
            uVar11 = Loop::GetLoopNumber(loop);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar16,pcVar17,(ulong)uVar11);
            pSVar24 = pMVar23->transferSym;
            SVar29 = 0xffffffff;
            if ((pSVar24 != (StackSym *)0x0) &&
               ((pSVar24->m_type == TyVar ||
                (pSVar24 = StackSym::GetVarEquivSym(pSVar24,(Func *)0x0), pSVar24 != (StackSym *)0x0
                )))) {
              SVar29 = (pSVar24->super_Sym).m_id;
            }
            Output::Print(L"Found illegal use of LdElemI value(s%d)",(ulong)SVar29);
            IR::Instr::DumpByteCodeOffset(instr_00);
            pcVar16 = Js::OpCodeUtil::GetOpCodeName(instr_00->m_opcode);
            Output::Print(L" (%s)",pcVar16);
            Output::Print(L"\n");
            Output::Flush();
            return false;
          }
        }
        ppIVar1 = &instr_00->m_next;
        pIVar30 = instr_00;
        instr_00 = *ppIVar1;
      } while (*ppIVar1 != pIVar5);
    }
    if (instr->m_dst == (Opnd *)0x0) {
      return true;
    }
    if (instr->m_opcode == IncrLoopBodyCount) {
      return true;
    }
    if (loop->memOpInfo == (MemOpInfo *)0x0) {
      return true;
    }
    pIVar5 = instr->m_prev;
    if (((pIVar5 != (Instr *)0x0 && instr->m_opcode == Ld_I4) &&
        (((pIVar5->m_opcode - 0x1c0 < 2 || (pIVar5->m_opcode == Ld_A)) &&
         (OVar10 = IR::Opnd::GetKind(instr->m_src1), OVar10 == OpndKindReg)))) &&
       ((OVar10 = IR::Opnd::GetKind(instr->m_dst), OVar10 == OpndKindReg &&
        (OVar10 = IR::Opnd::GetKind(pIVar5->m_dst), OVar10 == OpndKindReg)))) {
      pSVar24 = IR::Opnd::GetStackSym(instr->m_dst);
      pSVar25 = IR::Opnd::GetStackSym(pIVar5->m_src1);
      if (pSVar24 == pSVar25) {
        pSVar24 = IR::Opnd::GetStackSym(instr->m_src1);
        pSVar25 = IR::Opnd::GetStackSym(pIVar5->m_dst);
        if (pSVar24 == pSVar25) {
          return true;
        }
      }
    }
    this_02 = loop->memOpInfo->inductionVariableChangeInfoMap;
    pSVar24 = IR::Opnd::GetStackSym(instr->m_dst);
    SVar29 = 0xffffffff;
    if ((pSVar24 != (StackSym *)0x0) &&
       ((pSVar24->m_type == TyVar ||
        (pSVar24 = StackSym::GetVarEquivSym(pSVar24,(Func *)0x0), pSVar24 != (StackSym *)0x0)))) {
      SVar29 = (pSVar24->super_Sym).m_id;
    }
    local_b8[0] = SVar29;
    bVar9 = JsUtil::
            BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(this_02,local_b8);
    if (!bVar9) {
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x94a,
                       "(!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo || (instr->m_opcode == Js::OpCode::Ld_I4 && prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 || prevInstr->m_opcode == Js::OpCode::Sub_I4 || prevInstr->m_opcode == Js::OpCode::Ld_A ) && instr->GetSrc1()->IsRegOpnd() && instr->GetDst()->IsRegOpnd() && prevInstr->GetDst()->IsRegOpnd() && instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() && instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) || !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym())))"
                       ,
                       "!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo || (instr->m_opcode == Js::OpCode::Ld_I4 && prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 || prevInstr->m_opcode == Js::OpCode::Sub_I4 || prevInstr->m_opcode == Js::OpCode::Ld_A ) && instr->GetSrc1()->IsRegOpnd() && instr->GetDst()->IsRegOpnd() && prevInstr->GetDst()->IsRegOpnd() && instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() && instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) || !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym()))"
                      );
    if (bVar9) {
      *puVar13 = 0;
      return true;
    }
LAB_00447387:
    pcVar7 = (code *)invalidInstructionException();
    (*pcVar7)();
  }
  this_00 = instr->m_src2;
  OVar10 = IR::Opnd::GetKind(this_00);
  if (OVar10 == OpndKindReg) {
    pBVar4 = this->currentBlock;
    pRVar20 = IR::Opnd::AsRegOpnd(this_00);
    pVVar21 = GlobOptBlockData::FindValue(&pBVar4->globOptData,&pRVar20->m_sym->super_Sym);
    if ((pVVar21 == (Value *)0x0) || (pVVar21->valueInfo == (ValueInfo *)0x0)) {
LAB_0044710c:
      Loop::EnsureMemOpVariablesInitialized(loop);
    }
    else {
      bVar9 = ValueInfo::TryGetIntConstantValue(pVVar21->valueInfo,(int32 *)local_34,false);
      uVar8 = local_34[0];
      Loop::EnsureMemOpVariablesInitialized(loop);
      if ((bVar9) && (uVar8 == 1)) {
LAB_00447086:
        bVar9 = JsUtil::
                BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,local_b8);
        if (!bVar9) {
          local_34[0] = CONCAT31(local_34[0]._1_3_,bVar28) | 1;
          JsUtil::
          BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)loop->memOpInfo->inductionVariableChangeInfoMap,local_b8,
                     (InductionVariableChangeInfo *)local_34);
          if (*(SymID *)&this_04->intConstantToStackSymMap == local_b8[0]) {
            return true;
          }
          goto LAB_004471c1;
        }
        local_34[0] = (uint)local_34[0]._1_3_ << 8;
        pIVar27 = JsUtil::
                  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::Lookup(loop->memOpInfo->inductionVariableChangeInfoMap,local_b8,
                           (InductionVariableChangeInfo *)local_34);
        local_34[0] = CONCAT31(local_34[0]._1_3_,
                               ((char)*pIVar27 + 1U) - ((~(byte)*pIVar27 & 0x7f) == 0) & 0x7f |
                               bVar28);
        JsUtil::
        BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)loop->memOpInfo->inductionVariableChangeInfoMap,local_b8,
                   (InductionVariableChangeInfo *)local_34);
        if (*(SymID *)&this_04->intConstantToStackSymMap == local_b8[0]) {
          return true;
        }
        goto LAB_00447164;
      }
    }
  }
  else {
    OVar10 = IR::Opnd::GetKind(this_00);
    if (OVar10 != OpndKindIntConst) goto LAB_0044710c;
    pIVar26 = IR::Opnd::AsIntConstOpnd(this_00);
    lVar6 = (pIVar26->super_EncodableOpnd<long>).m_value;
    Loop::EnsureMemOpVariablesInitialized(loop);
    if (lVar6 == 1) goto LAB_00447086;
  }
  local_34[0] = CONCAT31(local_34[0]._1_3_,0x7f);
  bVar9 = JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,local_b8);
  this_03 = loop->memOpInfo->inductionVariableChangeInfoMap;
  if (!bVar9) {
    JsUtil::
    BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_03,local_b8,(InductionVariableChangeInfo *)local_34);
    if (*(SymID *)&this_04->intConstantToStackSymMap == local_b8[0]) {
      return true;
    }
LAB_004471c1:
    JsUtil::
    BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)loop->memOpInfo->inductionVariableChangeInfoMap,
               (uint *)&this_04->intConstantToStackSymMap,(InductionVariableChangeInfo *)local_34);
    return true;
  }
  JsUtil::
  BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this_03,local_b8,(InductionVariableChangeInfo *)local_34);
  if (*(SymID *)&this_04->intConstantToStackSymMap == local_b8[0]) {
    return true;
  }
LAB_00447164:
  JsUtil::
  BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)loop->memOpInfo->inductionVariableChangeInfoMap,
             (uint *)&this_04->intConstantToStackSymMap,(InductionVariableChangeInfo *)local_34);
  return true;
}

Assistant:

bool
GlobOpt::CollectMemOpInfo(IR::Instr *instrBegin, IR::Instr *instr, Value *src1Val, Value *src2Val)
{
    Assert(this->currentBlock->loop);

    Loop *loop = this->currentBlock->loop;

    if (!loop->blockList.HasTwo())
    {
        //  We support memcopy and memset for loops which have only two blocks.
        return false;
    }

    if (loop->GetLoopFlags().isInterpreted && !loop->GetLoopFlags().memopMinCountReached)
    {
        TRACE_MEMOP_VERBOSE(loop, instr, _u("minimum loop count not reached"))
        loop->doMemOp = false;
        return false;
    }
    Assert(loop->doMemOp);

    bool isIncr = true, isChangedByOne = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        if (!CollectMemOpStElementI(instr, loop))
        {
            loop->doMemOp = false;
            return false;
        }
        break;
    case Js::OpCode::LdElemI_A:
        if (!CollectMemOpLdElementI(instr, loop))
        {
            loop->doMemOp = false;
            return false;
        }
        break;
    case Js::OpCode::Sub_I4:
        isIncr = false;
    case Js::OpCode::Add_I4:
    {
        // The only case in which these OpCodes can contribute to an inductionVariableChangeInfo
        // is when the induction variable is being modified and overwritten aswell (ex: j = j + 1)
        // and not when the induction variable is modified but not overwritten (ex: k = j + 1).
        // This can either be detected in IR as
        // s1     = Add_I4 s1     1  // Case #1, can be seen with "j++".
        // or as
        // s4(s2) = Add_I4 s3(s1) 1  // Case #2, can be see with "j = j + 1".
        // s1     = Ld_A   s2
        bool isInductionVar = false;
        IR::Instr* nextInstr = instr->m_next;
        if (
            // Checks for Case #1 and Case #2
            instr->GetDst()->GetStackSym() != nullptr &&
            instr->GetDst()->IsRegOpnd() &&
            (
                // Checks for Case #1
                (instr->GetDst()->GetStackSym() == instr->GetSrc1()->GetStackSym()) ||

                // Checks for Case #2
                (nextInstr&& nextInstr->m_opcode == Js::OpCode::Ld_A &&
                 nextInstr->GetSrc1()->IsRegOpnd() &&
                 nextInstr->GetDst()->IsRegOpnd() &&
                 GetVarSymID(instr->GetDst()->GetStackSym()) == nextInstr->GetSrc1()->GetStackSym()->m_id &&
                 GetVarSymID(instr->GetSrc1()->GetStackSym()) == nextInstr->GetDst()->GetStackSym()->m_id)
            )
        )
        {
            isInductionVar = true;
        }
        
        // Even if dstIsInductionVar then dst == src1 so it's safe to use src1 as the induction sym always.
        StackSym* sym = instr->GetSrc1()->GetStackSym();

        SymID inductionSymID = GetVarSymID(sym);

        if (isInductionVar && IsSymIDInductionVariable(inductionSymID, this->currentBlock->loop))
        {
            if (!isChangedByOne)
            {
                IR::Opnd *src1, *src2;
                src1 = instr->GetSrc1();
                src2 = instr->GetSrc2();

                if (src2->IsRegOpnd())
                {
                    Value *val = CurrentBlockData()->FindValue(src2->AsRegOpnd()->m_sym);
                    if (val)
                    {
                        ValueInfo *vi = val->GetValueInfo();
                        int constValue;
                        if (vi && vi->TryGetIntConstantValue(&constValue))
                        {
                            if (constValue == 1)
                            {
                                isChangedByOne = true;
                            }
                        }
                    }
                }
                else if (src2->IsIntConstOpnd())
                {
                    if (src2->AsIntConstOpnd()->GetValue() == 1)
                    {
                        isChangedByOne = true;
                    }
                }
            }

            loop->EnsureMemOpVariablesInitialized();
            if (!isChangedByOne)
            {
                Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { Js::Constants::InvalidLoopUnrollFactor, 0 };

                if (!loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID))
                {
                    loop->memOpInfo->inductionVariableChangeInfoMap->Add(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Add(sym->m_id, inductionVariableChangeInfo);
                    }
                }
                else
                {
                    loop->memOpInfo->inductionVariableChangeInfoMap->Item(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Item(sym->m_id, inductionVariableChangeInfo);
                    }
                }
            }
            else
            {
                if (!loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID))
                {
                    Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 1, isIncr };
                    loop->memOpInfo->inductionVariableChangeInfoMap->Add(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Add(sym->m_id, inductionVariableChangeInfo);
                    }
                }
                else
                {
                    Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 0, 0 };
                    inductionVariableChangeInfo = loop->memOpInfo->inductionVariableChangeInfoMap->Lookup(inductionSymID, inductionVariableChangeInfo);

                    // If inductionVariableChangeInfo.unroll has been invalidated, do
                    // not modify the Js::Constants::InvalidLoopUnrollFactor value
                    if (inductionVariableChangeInfo.unroll != Js::Constants::InvalidLoopUnrollFactor)
                    {
                        inductionVariableChangeInfo.unroll++;
                    }
                    inductionVariableChangeInfo.isIncremental = isIncr;
                    loop->memOpInfo->inductionVariableChangeInfoMap->Item(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Item(sym->m_id, inductionVariableChangeInfo);
                    }
                }
            }
            break;
        }
        // Fallthrough if not an induction variable
    }
    default:
        FOREACH_INSTR_IN_RANGE(chkInstr, instrBegin->m_next, instr)
        {
            if (IsInstrInvalidForMemOp(chkInstr, loop, src1Val, src2Val))
            {
                loop->doMemOp = false;
                return false;
            }

            // Make sure this instruction doesn't use the memcopy transfer sym before it is checked by StElemI
            if (loop->memOpInfo && !loop->memOpInfo->candidates->Empty())
            {
                Loop::MemOpCandidate* prevCandidate = loop->memOpInfo->candidates->Head();
                if (prevCandidate->IsMemCopy())
                {
                    Loop::MemCopyCandidate* memcopyCandidate = prevCandidate->AsMemCopy();
                    if (memcopyCandidate->base == Js::Constants::InvalidSymID)
                    {
                        if (chkInstr->HasSymUse(memcopyCandidate->transferSym))
                        {
                            loop->doMemOp = false;
                            TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, chkInstr, _u("Found illegal use of LdElemI value(s%d)"), GetVarSymID(memcopyCandidate->transferSym));
                            return false;
                        }
                    }
                }
            }
        }
        NEXT_INSTR_IN_RANGE;
        IR::Instr* prevInstr = instr->m_prev;

        // If an instr where the dst is an induction variable (and thus is being written to) is not caught by a case in the above
        // switch statement (which implies that this instr does not contributes to a inductionVariableChangeInfo) and in the default
        // case does not set doMemOp to false (which implies that this instr does not invalidate this MemOp), then FailFast as we
        // should not be performing a MemOp under these conditions. 
        AssertOrFailFast(!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo ||

            // Refer to "Case #2" described above in this function. For the following IR:
            // Line #1: s4(s2) = Add_I4 s3(s1) 1
            // Line #2: s3(s1) = Ld_A   s4(s2)
            // do not consider line #2 as a violating instr
            (instr->m_opcode == Js::OpCode::Ld_I4 &&
                // note Ld_A is for the case where the add was 0
                prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 ||
                              prevInstr->m_opcode == Js::OpCode::Sub_I4 ||
                              prevInstr->m_opcode == Js::OpCode::Ld_A   ) &&
                instr->GetSrc1()->IsRegOpnd() &&
                instr->GetDst()->IsRegOpnd() &&
                prevInstr->GetDst()->IsRegOpnd() &&
                instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() &&
                instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) ||

            !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym())));
    }

    return true;
}